

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O2

bool iDynTree::doubleToStringWithClassicLocale(double *inDouble,string *outStr)

{
  int iVar1;
  double dVar2;
  char buf [25];
  char acStack_38 [32];
  
  dVar2 = ABS(*inDouble);
  if ((ulong)dVar2 < 0x7ff0000000000000) {
    iVar1 = idyntree_private_fpconv_dtoa(*inDouble,acStack_38);
    acStack_38[iVar1] = '\0';
    std::__cxx11::string::assign((char *)outStr);
  }
  return (ulong)dVar2 < 0x7ff0000000000000;
}

Assistant:

bool inline doubleToStringWithClassicLocale(const double & inDouble, std::string& outStr)
{
    if (std::isnan(inDouble) || std::isinf(inDouble)) {
        return false;
    }

    // fpconv returns nul-terminated strings, that can be converted directly to C++ std::string
    // see https://github.com/night-shift/fpconv/tree/4a087d1b2df765baa409536931916a2c082cdda4#example-usage
    char buf[24 + 1];
    int str_len = idyntree_private_fpconv_dtoa(inDouble, buf);
    buf[str_len] = '\0';
    outStr = buf;
    return true;
}